

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewDocFragment(xmlDocPtr doc)

{
  xmlRegisterNodeFunc *pp_Var1;
  xmlNodePtr cur;
  xmlDocPtr doc_local;
  
  doc_local = (xmlDocPtr)(*xmlMalloc)(0x78);
  if (doc_local == (xmlDocPtr)0x0) {
    xmlTreeErrMemory("building fragment");
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    memset(doc_local,0,0x78);
    doc_local->type = XML_DOCUMENT_FRAG_NODE;
    doc_local->doc = doc;
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var1 = __xmlRegisterNodeDefaultValue(), *pp_Var1 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var1 = __xmlRegisterNodeDefaultValue();
      (**pp_Var1)((xmlNodePtr)doc_local);
    }
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

xmlNodePtr
xmlNewDocFragment(xmlDocPtr doc) {
    xmlNodePtr cur;

    /*
     * Allocate a new DocumentFragment node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
	xmlTreeErrMemory("building fragment");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_DOCUMENT_FRAG_NODE;

    cur->doc = doc;

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);
}